

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O1

int __thiscall
sigs::
BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
::connect(BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined1 *puVar1;
  function<void()> *this_00;
  code *pcVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<sigs::ConnectionBase> *conn;
  undefined4 in_register_00000034;
  _func_void *p_Var4;
  _Any_data local_68;
  pointer local_58;
  undefined8 local_50;
  function<void()> *local_48;
  pointer local_40;
  undefined8 local_38;
  
  p_Var4 = (_func_void *)CONCAT44(in_register_00000034,__fd);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(p_Var4 + 0x20));
  if (iVar3 == 0) {
    this->_vptr_BasicSignal = (_func_int **)0x0;
    local_58 = (pointer)operator_new(0x30);
    *(undefined8 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(local_58->slot_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0016fdd8;
    local_68._8_8_ = &(local_58->slot_).super__Function_base._M_manager;
    (local_58->slot_).super__Function_base._M_manager = (_Manager_type)0x0;
    (local_58->slot_)._M_invoker = (_Invoker_type)0x0;
    (local_58->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_58->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->entries).
    super__Vector_base<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start = local_58;
    this->_vptr_BasicSignal = (_func_int **)local_68._8_8_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      *(undefined4 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8) = 2;
    }
    this_00 = (function<void()> *)this->_vptr_BasicSignal;
    local_68._M_unused._M_function_pointer = p_Var4;
    std::function<void()>::operator=(this_00,(anon_class_24_2_3fde98e7 *)&local_68);
    if (local_58 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
    }
    local_40 = (this->entries).
               super__Vector_base<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_40 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar1 = (undefined1 *)((long)&(local_40->slot_).super__Function_base._M_functor + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
        UNLOCK();
      }
      else {
        puVar1 = (undefined1 *)((long)&(local_40->slot_).super__Function_base._M_functor + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
      }
    }
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (pointer)0x0;
    local_50 = *(undefined8 *)(__addr[1].sa_data + 6);
    pcVar2 = *(code **)(__addr + 1);
    if (pcVar2 != (code *)0x0) {
      local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)__addr;
      local_68._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
      __addr[1].sa_family = 0;
      __addr[1].sa_data[0] = '\0';
      __addr[1].sa_data[1] = '\0';
      __addr[1].sa_data[2] = '\0';
      __addr[1].sa_data[3] = '\0';
      __addr[1].sa_data[4] = '\0';
      __addr[1].sa_data[5] = '\0';
      __addr[1].sa_data[6] = '\0';
      __addr[1].sa_data[7] = '\0';
      __addr[1].sa_data[8] = '\0';
      __addr[1].sa_data[9] = '\0';
      __addr[1].sa_data[10] = '\0';
      __addr[1].sa_data[0xb] = '\0';
      __addr[1].sa_data[0xc] = '\0';
      __addr[1].sa_data[0xd] = '\0';
      local_58 = (pointer)pcVar2;
    }
    local_38 = 0;
    local_48 = this_00;
    std::
    vector<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>>
    ::emplace_back<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>
              ((vector<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>>
                *)(p_Var4 + 8),(Entry *)&local_68);
    if (local_40 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
    }
    if (local_58 != (pointer)0x0) {
      (*(code *)local_58)(&local_68,&local_68,3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var4 + 0x20));
    return (int)this;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

Connection connect(Slot &&slot) noexcept
  {
    Lock lock(entriesMutex);
    auto conn = makeConnection();
    entries.emplace_back(Entry(std::move(slot), conn));
    return conn;
  }